

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O1

void ON_RenderContentPrivate::SetRenderContentNodeRecursive(ON_RenderContent *rc,ON_XMLNode *node)

{
  ON_RenderContentPrivate *pOVar1;
  ON_RenderContent *rc_00;
  int iVar2;
  ON_UUID *uuid;
  ON_XMLNode *this;
  undefined4 extraout_var;
  ChildIterator it;
  undefined1 local_120 [16];
  undefined8 *local_110;
  
  pOVar1 = rc->_private;
  ON_ModelComponent::Name((ON_ModelComponent *)local_120);
  ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)(local_120 + 8),(ON_wString *)local_120);
  SetPropertyValue(pOVar1,L"instance-name",(ON_XMLVariant *)(local_120 + 8));
  ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)(local_120 + 8));
  ON_wString::~ON_wString((ON_wString *)local_120);
  pOVar1 = rc->_private;
  uuid = ON_ModelComponent::Id(&rc->super_ON_ModelComponent);
  ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)(local_120 + 8),uuid);
  SetPropertyValue(pOVar1,L"instance-id",(ON_XMLVariant *)(local_120 + 8));
  ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)(local_120 + 8));
  this = (ON_XMLNode *)operator_new(0xe8);
  iVar2 = (*(rc->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x46])(rc);
  ON_XMLNode::ON_XMLNode(this,(ON_XMLNode *)CONCAT44(extraout_var,iVar2));
  (*node->_vptr_ON_XMLNode[0xb])(node,this);
  (*(rc->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x2f])(local_120 + 8,rc);
  while( true ) {
    rc_00 = (ON_RenderContent *)*local_110;
    if (rc_00 == (ON_RenderContent *)0x0) break;
    *local_110 = rc_00->_private->m_next_sibling;
    SetRenderContentNodeRecursive(rc_00,this);
  }
  ON_RenderContent::ChildIterator::~ChildIterator((ChildIterator *)(local_120 + 8));
  return;
}

Assistant:

void ON_RenderContentPrivate::SetRenderContentNodeRecursive(const ON_RenderContent& rc, ON_XMLNode& node) // Static.
{
  // Copy the component name to the XML instance name.
  rc._private->SetPropertyValue(ON_RENDER_CONTENT_INSTANCE_NAME, rc.Name());

  // Copy the component id to the XML instance id.
  rc._private->SetPropertyValue(ON_RENDER_CONTENT_INSTANCE_ID, rc.Id());

  auto* child_node = new ON_XMLNode(rc.XMLNode());
  node.AttachChildNode(child_node);

  auto it = rc.GetChildIterator();
  ON_RenderContent* child_rc;
  while (nullptr != (child_rc = it.GetNextChild()))
  {
    SetRenderContentNodeRecursive(*child_rc, *child_node);
  }
}